

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

OneOf<kj::CompressionParameters,_kj::Exception> *
kj::_::tryParseExtensionAgreement
          (OneOf<kj::CompressionParameters,_kj::Exception> *__return_storage_ptr__,
          Maybe<kj::CompressionParameters> *clientOffer,StringPtr agreedParameters)

{
  bool bVar1;
  char *pcVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  undefined1 auVar4 [16];
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ArrayPtr<const_char> *pAVar8;
  char delim;
  ulong in_R8;
  String *__return_storage_ptr___00;
  ArrayPtr<const_char> *pAVar9;
  ushort uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> offers;
  Maybe<kj::CompressionParameters> local_268;
  Vector<kj::ArrayPtr<const_char>_> local_238;
  ArrayPtr<const_char> local_218;
  Vector<kj::ArrayPtr<const_char>_> local_208;
  undefined1 local_1e8 [16];
  ArrayDisposer *local_1d8;
  ArrayPtr<const_char> local_1c8;
  undefined1 local_1b8 [40];
  undefined1 local_190 [16];
  ArrayDisposer *local_180;
  Disposer *local_178;
  Context *pCStack_170;
  undefined1 local_168 [16];
  ArrayDisposer *local_158;
  undefined1 local_150 [264];
  undefined1 local_48 [16];
  Detail *local_38;
  ArrayDisposer *pAStack_30;
  
  __return_storage_ptr___00 = (String *)local_1e8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_R8;
  Debug::makeDescriptionInternal
            (__return_storage_ptr___00,(Debug *)0x4b4903,(char *)0x0,
             (ArrayPtr<kj::String>)(auVar4 << 0x40));
  pAVar8 = (ArrayPtr<const_char> *)0x148f;
  Exception::Exception
            ((Exception *)local_1b8,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x148f,__return_storage_ptr___00);
  delim = (char)__return_storage_ptr___00;
  uVar6 = local_1e8._0_8_;
  if ((char *)local_1e8._0_8_ != (char *)0x0) {
    pAVar8 = (ArrayPtr<const_char> *)local_1e8._8_8_;
    local_1e8 = (undefined1  [16])0x0;
    pAVar9 = pAVar8;
    (**local_1d8->_vptr_ArrayDisposer)(local_1d8,uVar6,1,pAVar8,pAVar8,0);
    delim = (char)pAVar9;
  }
  if ((clientOffer->ptr).isSet == false) {
    local_208.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x23;
    local_208.builder.ptr = (ArrayPtr<const_char> *)"Server failed WebSocket handshake: ";
    local_238.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x3d;
    local_238.builder.ptr =
         (ArrayPtr<const_char> *)"added Sec-WebSocket-Extensions when client did not offer any.";
    concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)&local_268,(_ *)&local_208,(ArrayPtr<const_char> *)&local_238,pAVar8);
    uVar7 = local_190._8_8_;
    uVar6 = local_190._0_8_;
    if ((char *)local_190._0_8_ != (char *)0x0) {
      local_190 = (undefined1  [16])0x0;
      (**local_180->_vptr_ArrayDisposer)(local_180,uVar6,1,uVar7,uVar7,0);
    }
    __return_storage_ptr__->tag = 2;
    *(undefined8 *)&__return_storage_ptr__->field_1 = local_1b8._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1b8._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_1b8._16_8_;
    local_1b8._0_8_ = (char *)0x0;
    local_1b8._8_8_ = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = local_1b8._24_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_1b8._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_268.ptr._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_268.ptr.field_1._0_8_;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x38) =
         CONCAT71(local_268.ptr.field_1._9_7_,
                  local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet);
    local_190 = ZEXT816(0);
    *(Disposer **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_178;
    *(Context **)((long)&__return_storage_ptr__->field_1 + 0x48) = pCStack_170;
    pCStack_170 = (Context *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) = local_168._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = local_168._8_8_;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x60) = local_158;
    local_168 = (undefined1  [16])0x0;
    memcpy((void *)((long)&__return_storage_ptr__->field_1 + 0x68),local_150,0x105);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x170) = local_48._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x178) = local_48._8_8_;
    *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x180) = local_38;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x188) = pAStack_30;
    local_38 = (Detail *)0x0;
    local_48 = (undefined1  [16])0x0;
    goto LAB_0038fd77;
  }
  input.size_ = 0x2c;
  input.ptr = (char *)(agreedParameters.content.size_ - 1);
  splitParts(&local_208,(_ *)agreedParameters.content.ptr,input,delim);
  if ((ArrayPtr<const_char> *)((long)local_208.builder.pos - (long)local_208.builder.ptr) ==
      (ArrayPtr<const_char> *)0x10) {
    input_00.size_ = 0x3b;
    input_00.ptr = (char *)(local_208.builder.ptr)->size_;
    pAVar8 = (ArrayPtr<const_char> *)0x3b;
    splitParts(&local_238,(_ *)(local_208.builder.ptr)->ptr,input_00,delim);
    if ((local_238.builder.ptr)->size_ == 0x12) {
      pcVar2 = (local_238.builder.ptr)->ptr;
      auVar11[0] = -(*pcVar2 == 'p');
      auVar11[1] = -(pcVar2[1] == 'e');
      auVar11[2] = -(pcVar2[2] == 'r');
      auVar11[3] = -(pcVar2[3] == 'm');
      auVar11[4] = -(pcVar2[4] == 'e');
      auVar11[5] = -(pcVar2[5] == 's');
      auVar11[6] = -(pcVar2[6] == 's');
      auVar11[7] = -(pcVar2[7] == 'a');
      auVar11[8] = -(pcVar2[8] == 'g');
      auVar11[9] = -(pcVar2[9] == 'e');
      auVar11[10] = -(pcVar2[10] == '-');
      auVar11[0xb] = -(pcVar2[0xb] == 'd');
      auVar11[0xc] = -(pcVar2[0xc] == 'e');
      auVar11[0xd] = -(pcVar2[0xd] == 'f');
      auVar11[0xe] = -(pcVar2[0xe] == 'l');
      auVar11[0xf] = -(pcVar2[0xf] == 'a');
      auVar12[0] = -((char)*(undefined2 *)(pcVar2 + 0x10) == 't');
      auVar12[1] = -((char)((ushort)*(undefined2 *)(pcVar2 + 0x10) >> 8) == 'e');
      auVar12[2] = 0xff;
      auVar12[3] = 0xff;
      auVar12[4] = 0xff;
      auVar12[5] = 0xff;
      auVar12[6] = 0xff;
      auVar12[7] = 0xff;
      auVar12[8] = 0xff;
      auVar12[9] = 0xff;
      auVar12[10] = 0xff;
      auVar12[0xb] = 0xff;
      auVar12[0xc] = 0xff;
      auVar12[0xd] = 0xff;
      auVar12[0xe] = 0xff;
      auVar12[0xf] = 0xff;
      auVar12 = auVar12 & auVar11;
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0038f91e;
      tryExtractParameters(&local_268,&local_238,true);
      if (local_268.ptr.isSet != true) {
        local_218.ptr = "Server failed WebSocket handshake: ";
        local_218.size_ = 0x23;
        local_1c8.ptr =
             "the Sec-WebSocket-Extensions header in the Response included an invalid value.";
        local_1c8.size_ = 0x4e;
        concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((String *)&local_268,(_ *)&local_218,&local_1c8,pAVar8);
        uVar7 = local_190._8_8_;
        uVar6 = local_190._0_8_;
        if ((char *)local_190._0_8_ != (char *)0x0) {
          local_190 = (undefined1  [16])0x0;
          (**local_180->_vptr_ArrayDisposer)(local_180,uVar6,1,uVar7,uVar7,0);
        }
        goto LAB_0038f992;
      }
      if ((clientOffer->ptr).isSet == false) {
        local_218.ptr = (char *)0x0;
        local_268.ptr._0_16_ = (undefined1  [16])0x0;
        Debug::Fault::init((Fault *)&local_218,
                           (EVP_PKEY_CTX *)
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                          );
        Debug::Fault::fatal((Fault *)&local_218);
      }
      bVar1 = (clientOffer->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet;
      if (local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet == false) {
        if (bVar1 != false) {
          local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1 =
               *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                ((long)&(clientOffer->ptr).field_1 + 0x10);
          local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet = (bool)'\x01';
        }
      }
      else if (bVar1 != false) {
        aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                ((long)&(clientOffer->ptr).field_1 + 0x10))->value;
        if (aVar3.value < (ulong)local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1) {
          local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1 = aVar3;
          local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet = (bool)'\x01';
        }
      }
      uVar10 = (ushort)(clientOffer->ptr).field_1.value.outboundNoContextTakeover;
      if (local_268.ptr.field_1._0_1_ != '\0') {
        uVar10 = 0;
      }
      __return_storage_ptr__->tag = 1;
      *(ushort *)&__return_storage_ptr__->field_1 = uVar10 | local_268.ptr.field_1._0_2_;
      (__return_storage_ptr__->field_1).space[8] =
           local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet;
      if (local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet != false) {
        ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
        ((long)&__return_storage_ptr__->field_1 + 0x10))->value =
             (unsigned_long)local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
      }
      (__return_storage_ptr__->field_1).space[0x18] =
           local_268.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet;
      if (local_268.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet != false) {
        *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
         ((long)&__return_storage_ptr__->field_1 + 0x20) =
             local_268.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
      }
    }
    else {
LAB_0038f91e:
      local_218.ptr = "Server failed WebSocket handshake: ";
      local_218.size_ = 0x23;
      local_1c8.ptr =
           "response included a Sec-WebSocket-Extensions value that was not permessage-deflate.";
      local_1c8.size_ = 0x53;
      concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&local_268,(_ *)&local_218,&local_1c8,pAVar8);
      uVar7 = local_190._8_8_;
      uVar6 = local_190._0_8_;
      if ((char *)local_190._0_8_ != (char *)0x0) {
        local_190 = (undefined1  [16])0x0;
        (**local_180->_vptr_ArrayDisposer)(local_180,uVar6,1,uVar7,uVar7,0);
      }
LAB_0038f992:
      __return_storage_ptr__->tag = 2;
      *(undefined8 *)&__return_storage_ptr__->field_1 = local_1b8._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1b8._8_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_1b8._16_8_;
      local_1b8._0_8_ = (char *)0x0;
      local_1b8._8_8_ = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = local_1b8._24_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_1b8._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_268.ptr._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_268.ptr.field_1._0_8_;
      *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x38) =
           CONCAT71(local_268.ptr.field_1._9_7_,
                    local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet);
      local_190 = ZEXT816(0);
      *(Disposer **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_178;
      *(Context **)((long)&__return_storage_ptr__->field_1 + 0x48) = pCStack_170;
      pCStack_170 = (Context *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) = local_168._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = local_168._8_8_;
      *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x60) = local_158;
      local_168 = (undefined1  [16])0x0;
      memcpy((void *)((long)&__return_storage_ptr__->field_1 + 0x68),local_150,0x105);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x170) = local_48._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x178) = local_48._8_8_;
      *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x180) = local_38;
      *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x188) = pAStack_30;
      local_38 = (Detail *)0x0;
      local_48 = (undefined1  [16])0x0;
    }
    pAVar9 = local_238.builder.endPtr;
    pAVar8 = local_238.builder.ptr;
    if (local_238.builder.ptr != (ArrayPtr<const_char> *)0x0) {
      pRVar5 = local_238.builder.pos;
      local_238.builder.ptr = (ArrayPtr<const_char> *)0x0;
      local_238.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
      local_238.builder.endPtr = (ArrayPtr<const_char> *)0x0;
      (**(local_238.builder.disposer)->_vptr_ArrayDisposer)
                (local_238.builder.disposer,pAVar8,0x10,(long)pRVar5 - (long)pAVar8 >> 4,
                 (long)pAVar9 - (long)pAVar8 >> 4,0);
    }
  }
  else {
    local_238.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x23;
    local_238.builder.ptr = (ArrayPtr<const_char> *)"Server failed WebSocket handshake: ";
    local_218.ptr =
         "expected exactly one extension (permessage-deflate) but received more than one.";
    local_218.size_ = 0x4f;
    concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)&local_268,(_ *)&local_238,&local_218,
               (ArrayPtr<const_char> *)((long)local_208.builder.pos - (long)local_208.builder.ptr));
    uVar7 = local_190._8_8_;
    uVar6 = local_190._0_8_;
    if ((char *)local_190._0_8_ != (char *)0x0) {
      local_190 = (undefined1  [16])0x0;
      (**local_180->_vptr_ArrayDisposer)(local_180,uVar6,1,uVar7,uVar7,0);
    }
    __return_storage_ptr__->tag = 2;
    *(undefined8 *)&__return_storage_ptr__->field_1 = local_1b8._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1b8._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_1b8._16_8_;
    local_1b8._0_8_ = (char *)0x0;
    local_1b8._8_8_ = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = local_1b8._24_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_1b8._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_268.ptr._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_268.ptr.field_1._0_8_;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x38) =
         CONCAT71(local_268.ptr.field_1._9_7_,
                  local_268.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet);
    local_190 = ZEXT816(0);
    *(Disposer **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_178;
    *(Context **)((long)&__return_storage_ptr__->field_1 + 0x48) = pCStack_170;
    pCStack_170 = (Context *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) = local_168._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = local_168._8_8_;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x60) = local_158;
    local_168 = (undefined1  [16])0x0;
    memcpy((void *)((long)&__return_storage_ptr__->field_1 + 0x68),local_150,0x105);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x170) = local_48._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x178) = local_48._8_8_;
    *(Detail **)((long)&__return_storage_ptr__->field_1 + 0x180) = local_38;
    *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x188) = pAStack_30;
    local_38 = (Detail *)0x0;
    local_48 = (undefined1  [16])0x0;
  }
  pAVar9 = local_208.builder.endPtr;
  pAVar8 = local_208.builder.ptr;
  if (local_208.builder.ptr != (ArrayPtr<const_char> *)0x0) {
    pRVar5 = local_208.builder.pos;
    local_208.builder.ptr = (ArrayPtr<const_char> *)0x0;
    local_208.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
    local_208.builder.endPtr = (ArrayPtr<const_char> *)0x0;
    (**(local_208.builder.disposer)->_vptr_ArrayDisposer)
              (local_208.builder.disposer,pAVar8,0x10,(long)pRVar5 - (long)pAVar8 >> 4,
               (long)pAVar9 - (long)pAVar8 >> 4,0);
  }
LAB_0038fd77:
  Exception::~Exception((Exception *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

kj::OneOf<CompressionParameters, kj::Exception> tryParseExtensionAgreement(
    const Maybe<CompressionParameters>& clientOffer,
    StringPtr agreedParameters) {
  // Like `tryParseExtensionOffers`, but called by the client when parsing the server's Response.
  // If the client must decline the agreement, we want to provide some details about what went wrong
  // (since the client has to fail the connection).
  constexpr auto FAILURE = "Server failed WebSocket handshake: "_kj;
  auto e = KJ_EXCEPTION(FAILED);

  if (clientOffer == kj::none) {
    // We've received extensions when we did not send any in the first place.
    e.setDescription(
        kj::str(FAILURE, "added Sec-WebSocket-Extensions when client did not offer any."));
    return kj::mv(e);
  }

  auto offers = splitParts(agreedParameters, ',');
  if (offers.size() != 1) {
    constexpr auto EXPECT = "expected exactly one extension (permessage-deflate) but received "
                            "more than one."_kj;
    e.setDescription(kj::str(FAILURE, EXPECT));
    return kj::mv(e);
  }
  auto splitOffer = splitParts(offers.front(), ';');

  if (splitOffer.front() != "permessage-deflate"_kj) {
    e.setDescription(kj::str(FAILURE, "response included a Sec-WebSocket-Extensions value that was "
                                      "not permessage-deflate."));
    return kj::mv(e);
  }

  // Verify the parameters of our single extension, and compare it with the clients original offer.
  KJ_IF_SOME(config, tryExtractParameters(splitOffer, true)) {
    const auto& client = KJ_ASSERT_NONNULL(clientOffer);
    // The server might have ignored the client's hints regarding its compressor's configuration.
    // That's fine, but as the client, we still want to use those outbound compression parameters.
    if (config.outboundMaxWindowBits == kj::none) {
      config.outboundMaxWindowBits = client.outboundMaxWindowBits;
    } else KJ_IF_SOME(value, client.outboundMaxWindowBits) {
      if (value < KJ_ASSERT_NONNULL(config.outboundMaxWindowBits)) {
        // If the client asked for a value smaller than what the server responded with, use the
        // value that the client originally specified.
        config.outboundMaxWindowBits = value;
      }
    }
    if (config.outboundNoContextTakeover == false) {
      config.outboundNoContextTakeover = client.outboundNoContextTakeover;
    }
    return kj::mv(config);
  }

  // There was a problem parsing the server's `Sec-WebSocket-Extensions` response.
  e.setDescription(kj::str(FAILURE, "the Sec-WebSocket-Extensions header in the Response included "
      "an invalid value."));
  return kj::mv(e);
}